

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O3

string * __thiscall
wabt::LoadStoreTracking::GenTypeDecl
          (string *__return_storage_ptr__,LoadStoreTracking *this,string *name)

{
  int iVar1;
  _Rb_tree_node_base *p_Var2;
  const_iterator cVar3;
  _Base_ptr p_Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  uint uVar5;
  ulong uVar6;
  string s;
  string local_60;
  _Rb_tree_node_base *local_40;
  char *local_38;
  
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
                  *)this,name);
  if ((_Rb_tree_header *)cVar3._M_node != &(this->vars)._M_t._M_impl.super__Rb_tree_header) {
    if (*(char *)&cVar3._M_node[3]._M_left == '\x01') {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"{ ","");
      p_Var4 = cVar3._M_node[2]._M_right;
      if (p_Var4 != (_Base_ptr)&cVar3._M_node[2]._M_parent) {
        local_40 = (_Rb_tree_node_base *)&cVar3._M_node[2]._M_parent;
        do {
          if (p_Var4[2]._M_color == _S_red) {
            uVar6 = 0;
          }
          else {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            uVar6 = (ulong)p_Var4[2]._M_color;
          }
          local_60._M_string_length = 0;
          local_60.field_2._M_local_buf[0] = '\0';
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          do {
            uVar5 = (uint)uVar6;
            std::__cxx11::string::push_back((char)&local_60);
            uVar6 = (ulong)((int)(uVar6 / 0x1a) - 1);
          } while (0x19 < uVar5);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,
                            CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                     local_60.field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          p_Var2 = local_40;
          iVar1 = *(int *)&p_Var4[1]._M_left;
          switch(iVar1) {
          case 4:
            break;
          case 6:
            break;
          case 7:
            break;
          case -0x11:
            break;
          case -0x10:
            break;
          case -0xf:
          case -0xe:
          case -0xd:
          case -0xc:
          case -0xb:
          case -10:
          case -9:
          case -8:
          case 0:
          case 1:
          case 2:
          case 3:
          case 5:
switchD_00132a9e_caseD_fffffff1:
            break;
          case -7:
            break;
          case -6:
            break;
          case -5:
            break;
          case -4:
            break;
          case -3:
            break;
          case -2:
            break;
          case -1:
            break;
          default:
            if ((iVar1 != -0x40) && (iVar1 != -0x20)) goto switchD_00132a9e_caseD_fffffff1;
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
        } while (p_Var4 != p_Var2);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    iVar1 = *(int *)((long)&cVar3._M_node[3]._M_left + 4);
    if (iVar1 != -0x40) {
      switch(iVar1) {
      case 4:
        local_38 = "ubyte";
        break;
      case 6:
        local_38 = "ushort";
        break;
      case 7:
        local_38 = "uint";
        break;
      case -0x11:
        local_38 = "externref";
        break;
      case -0x10:
        local_38 = "funcref";
        break;
      case -7:
        local_38 = "short";
        break;
      case -6:
        local_38 = "byte";
        break;
      case -5:
        local_38 = "simd";
        break;
      case -4:
        local_38 = "double";
        break;
      case -3:
        local_38 = "float";
        break;
      case -2:
        local_38 = "long";
        break;
      case -1:
        local_38 = "int";
        break;
      default:
        if (iVar1 == -0x20) {
          local_38 = "func";
          break;
        }
      case -0xf:
      case -0xe:
      case -0xd:
      case -0xc:
      case -0xb:
      case -10:
      case -9:
      case -8:
      case 0:
      case 1:
      case 2:
      case 3:
      case 5:
        local_38 = "ILLEGAL";
      }
      GenAlign_abi_cxx11_(&local_60,this,*(Address *)(cVar3._M_node + 4),
                          (Opcode)*(Enum *)&cVar3._M_node[4]._M_parent);
      cat<char_const*,char[5],std::__cxx11::string>
                (__return_storage_ptr__,(wabt *)&local_38,(char **)"_ptr",(char (*) [5])&local_60,
                 in_R8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                 local_60.field_2._M_local_buf[0]) + 1);
      }
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeDecl(const std::string& name) const {
    auto it = vars.find(name);
    if (it == vars.end()) {
      return "";
    }
    if (it->second.struct_layout) {
      std::string s = "{ ";
      for (auto& access : it->second.accesses) {
        if (access.second.idx) {
          s += ", ";
        }
        s += IdxToName(access.second.idx);
        s += ':';
        s += GetDecompTypeName(access.second.type);
      }
      s += " }";
      return s;
    }
    // We don't have a struct layout, or the struct has just one field,
    // so maybe we can just declare it as a pointer to one type?
    if (it->second.same_type != Type::Void) {
      return cat(GetDecompTypeName(it->second.same_type), "_ptr",
                 GenAlign(it->second.same_align, it->second.last_opc));
    }
    return "";
  }